

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_string_float_limit(char *string,int prec)

{
  char *local_20;
  char *c;
  int dot;
  int prec_local;
  char *string_local;
  
  c._0_4_ = 0;
  local_20 = string;
LAB_001573ba:
  do {
    if (*local_20 == '\0') {
LAB_00157417:
      return (int)local_20 - (int)string;
    }
    if (*local_20 == '.') {
      c._0_4_ = 1;
      local_20 = local_20 + 1;
      goto LAB_001573ba;
    }
    if ((int)c == prec + 1) {
      *local_20 = '\0';
      goto LAB_00157417;
    }
    if (0 < (int)c) {
      c._0_4_ = (int)c + 1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

NK_LIB int
nk_string_float_limit(char *string, int prec)
{
    int dot = 0;
    char *c = string;
    while (*c) {
        if (*c == '.') {
            dot = 1;
            c++;
            continue;
        }
        if (dot == (prec+1)) {
            *c = 0;
            break;
        }
        if (dot > 0) dot++;
        c++;
    }
    return (int)(c - string);
}